

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O3

void __thiscall SynthWidget::setEmuModeText(SynthWidget *this)

{
  QLabel *pQVar1;
  QArrayData *pQVar2;
  undefined8 uVar3;
  QArrayData *pQVar4;
  undefined8 uVar5;
  ROMInfo *pRVar6;
  storage_type *psVar7;
  char *__s;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QString t;
  ROMImage *controlROMImage;
  ROMImage *pcmROMImage;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  ROMImage *local_20;
  ROMImage *local_18;
  
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  local_20 = (ROMImage *)0x0;
  local_18 = (ROMImage *)0x0;
  SynthRoute::getROMImages(this->synthRoute,&local_20,&local_18);
  if (local_20 == (ROMImage *)0x0) {
    __s = "Unknown";
  }
  else {
    pRVar6 = MT32Emu::ROMImage::getROMInfo(local_20);
    __s = pRVar6->description;
    if (__s == (char *)0x0) {
      psVar7 = (storage_type *)0x0;
      goto LAB_0015f96f;
    }
  }
  psVar7 = (storage_type *)strlen(__s);
LAB_0015f96f:
  QVar8.m_data = psVar7;
  QVar8.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar8);
  uVar5 = uStack_30;
  pQVar4 = local_38;
  uVar3 = local_48;
  pQVar2 = local_58;
  local_58 = local_38;
  local_38 = pQVar2;
  uStack_30 = uStack_50;
  uStack_50 = uVar5;
  local_48 = local_28;
  local_28 = uVar3;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,8);
    }
  }
  pQVar1 = (this->ui->super_Ui_SynthWidget).synthEmuModeLabel;
  QVar9.m_data = (storage_type *)0x10;
  QVar9.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar9);
  QString::append((QString *)&local_58);
  QLabel::setText((QString *)pQVar1);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  return;
}

Assistant:

void SynthWidget::setEmuModeText() {
	QString emuMode;
	const MT32Emu::ROMImage *controlROMImage = NULL;
	const MT32Emu::ROMImage *pcmROMImage = NULL;
	synthRoute->getROMImages(controlROMImage, pcmROMImage);
	emuMode = controlROMImage == NULL ? "Unknown" : controlROMImage->getROMInfo()->description;
	ui->synthEmuModeLabel->setText("Emulation Mode: " + emuMode);
}